

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O3

void streamMetaInformationCb(StreamClient *stream,string *method,Value *params)

{
  bool bVar1;
  int iVar2;
  Value *this;
  ostream *poVar3;
  pointer pbVar4;
  const_iterator cVar5;
  signalReferences_t signalReferences;
  signalReferences_t local_78;
  undefined1 local_60 [32];
  ValueIteratorBase local_40;
  
  iVar2 = std::__cxx11::string::compare((char *)method);
  if (iVar2 == 0) {
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cVar5 = Json::Value::begin(params);
    local_40.current_ = cVar5.super_ValueIteratorBase.current_._M_node;
    local_40.isNull_ = cVar5.super_ValueIteratorBase.isNull_;
    while( true ) {
      cVar5 = Json::Value::end(params);
      local_60._0_8_ = cVar5.super_ValueIteratorBase.current_._M_node;
      local_60[8] = cVar5.super_ValueIteratorBase.isNull_;
      bVar1 = Json::ValueIteratorBase::isEqual(&local_40,(SelfType *)local_60);
      if (bVar1) break;
      this = Json::ValueIteratorBase::deref(&local_40);
      Json::Value::asString_abi_cxx11_((string *)local_60,this);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 (string *)local_60);
      if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)(local_60 + 0x10)) {
        operator_delete((void *)local_60._0_8_);
      }
      Json::ValueIteratorBase::increment(&local_40);
    }
    hbm::streaming::StreamClient::subscribe(stream,&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"streamMetaInformationCb",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"the following signal(s) were subscribed: ",0x29);
    pbVar4 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pbVar4->_M_dataplus)._M_p,
                            pbVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' ",2);
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
  }
  return;
}

Assistant:

static void streamMetaInformationCb(hbm::streaming::StreamClient& stream, const std::string& method, const Json::Value& params)
{
	if (method==hbm::streaming::META_METHOD_AVAILABLE) {
		// simply subscibe all signals that become available.
		hbm::streaming::signalReferences_t signalReferences;
		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			signalReferences.push_back(element.asString());
		}

		try {
			stream.subscribe(signalReferences);
			std::cout << __FUNCTION__ << "the following signal(s) were subscribed: ";
		} catch(const std::runtime_error& e) {
			std::cerr << __FUNCTION__ << "error '" << e.what() << "' subscribing the following signal(s): ";
		}

		for(hbm::streaming::signalReferences_t::const_iterator iter=signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
			std::cout << "'" << *iter << "' ";
		}
		std::cout << std::endl;
	}
}